

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O1

uint64_t farmhash64_uo_with_seeds(char *s,size_t len,uint64_t seed0,uint64_t seed1)

{
  uint64_t uVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong local_60;
  
  if (len < 0x41) {
    uVar1 = farmhash64_na(s,len);
    uVar4 = (uVar1 - seed0 ^ seed1) * -0x622015f714c7d297;
    uVar4 = (uVar4 >> 0x2f ^ seed1 ^ uVar4) * -0x622015f714c7d297;
    uVar1 = (uVar4 >> 0x2f ^ uVar4) * -0x622015f714c7d297;
  }
  else {
    plVar2 = (long *)(s + (len - 1 & 0xffffffffffffffc0));
    uVar4 = (ulong)((uint)(len - 1) & 0x3f);
    if (s + (len - 0x40) != (char *)((uVar4 - 0x3f) + (long)plVar2)) {
      __assert_fail("s + len - 64 == last64",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sonntex[P]smhasher/farmhash-c.c"
                    ,0x1f5,
                    "uint64_t farmhash64_uo_with_seeds(const char *, size_t, uint64_t, uint64_t)");
    }
    lVar11 = seed1 * -0x651e95c4d06fbfb1 + 0x71;
    uVar9 = (ulong)(lVar11 * -0x651e95c4d06fbfb1) >> 0x2f ^ lVar11 * -0x651e95c4d06fbfb1;
    local_60 = uVar9 * -0x651e95c4d06fbfb1;
    lVar16 = seed0 + uVar9 * 0x651e95c4d06fbfb1;
    lVar3 = (ulong)((uint)lVar16 & 0x82) + 0x9ae16a3b2f90404f;
    lVar19 = seed0 * -0x651e95c4d06fbfb1;
    lVar6 = 0;
    uVar9 = 0;
    do {
      lVar20 = *(long *)((long)s + 8);
      lVar5 = *(long *)((long)s + 0x30);
      lVar10 = uVar9 + *(long *)((long)s + 0x38);
      uVar9 = (local_60 + *(long *)((long)s + 0x18)) * lVar3;
      lVar14 = (uVar9 >> 0x20 | uVar9 << 0x20) + lVar10;
      lVar17 = *(long *)s + lVar5 + lVar14 * 9;
      uVar12 = lVar11 + *(long *)((long)s + 0x10);
      uVar9 = seed0 + *(long *)((long)s + 0x20);
      lVar18 = (uVar9 >> 0x21 | uVar9 * 0x80000000) + *(long *)((long)s + 0x10);
      uVar7 = seed1 + lVar20 + *(long *)((long)s + 0x28);
      uVar9 = lVar19 + *(long *)s + lVar20;
      uVar9 = (uVar9 >> 0x1a | uVar9 << 0x26) * 9;
      lVar6 = (lVar6 + lVar5 ^ uVar9) * 9 + *(long *)((long)s + 0x20);
      lVar20 = uVar9 + lVar20;
      local_60 = uVar12 >> 0x1d | uVar12 << 0x23;
      lVar11 = lVar16 + *(long *)((long)s + 0x38) + lVar18;
      lVar16 = lVar20 - lVar11;
      seed0 = lVar18 + lVar16;
      uVar9 = lVar5 + *(long *)((long)s + 0x28) + lVar10 + lVar14 + lVar16;
      seed1 = (uVar7 >> 0x1e | uVar7 << 0x22) + *(long *)((long)s + 0x18) + lVar6;
      lVar6 = lVar6 + seed1;
      lVar19 = lVar20 + uVar9;
      uVar9 = uVar9 >> 0x22 | uVar9 * 0x40000000;
      s = (char *)((long)s + 0x40);
      lVar16 = lVar17;
    } while ((long *)s != plVar2);
    uVar8 = seed1 >> 0x1c | seed1 << 0x24;
    uVar15 = seed0 >> 0x14 | seed0 << 0x2c;
    lVar17 = lVar17 * 9 + lVar11;
    uVar13 = lVar11 + lVar17;
    lVar16 = *(long *)((long)plVar2 + (uVar4 - 0x37));
    lVar11 = *(long *)((long)plVar2 + (uVar4 - 0x2f));
    uVar12 = (uVar15 - lVar19) + lVar16 + uVar13;
    uVar7 = *(ulong *)((long)plVar2 + (uVar4 - 0xf));
    uVar13 = uVar8 ^ uVar7 ^ uVar13;
    uVar12 = uVar9 * 9 ^ (uVar12 >> 0x25 | uVar12 * 0x8000000) * lVar3;
    lVar19 = *(long *)((long)plVar2 + (uVar4 - 0x17));
    uVar15 = uVar15 + lVar19 + (uVar13 >> 0x2a | uVar13 << 0x16) * lVar3;
    local_60 = local_60 + lVar6 + uVar4;
    uVar13 = local_60 >> 0x21 | local_60 * 0x80000000;
    lVar5 = uVar13 * lVar3;
    lVar20 = *(long *)((long)plVar2 + (uVar4 - 7));
    lVar10 = uVar9 + lVar5 + *(long *)((long)plVar2 + (uVar4 - 0x1f));
    uVar21 = lVar19 + uVar7 + lVar10;
    lVar19 = uVar8 * lVar3 + *(long *)((long)plVar2 + (uVar4 - 0x3f));
    lVar14 = *(long *)((long)plVar2 + (uVar4 - 0x27)) + uVar12;
    uVar4 = lVar6 + uVar4 + lVar19 + lVar14;
    uVar7 = lVar16 + lVar11 + lVar19;
    uVar8 = uVar21 + lVar20 ^ uVar15;
    uVar9 = (uVar7 + lVar14 ^ uVar8) * lVar3;
    uVar8 = (uVar9 >> 0x2f ^ uVar8 ^ uVar9) * lVar3;
    uVar9 = lVar11 + uVar15 + lVar20 + lVar10;
    uVar9 = lVar10 + lVar5 + (uVar21 >> 0x2c | uVar21 * 0x100000) + (uVar9 >> 0x15 | uVar9 << 0x2b);
    uVar4 = ((uVar7 >> 0x2c | uVar7 * 0x100000) + lVar19 + uVar15 + (uVar4 >> 0x15 | uVar4 << 0x2b)
            ^ uVar9) * -0x651e95c4d06fbfb1;
    uVar4 = uVar4 >> 0x2f ^ uVar9 ^ uVar4;
    uVar12 = (uVar4 * -0x41befec400000000 | uVar4 * -0x651e95c4d06fbfb1 >> 0x1e) *
             -0x651e95c4d06fbfb1 ^ uVar12;
    uVar4 = (((uVar8 >> 0x2f ^ uVar8) + uVar13) * lVar3 - lVar17 ^ uVar12) * -0x651e95c4d06fbfb1;
    uVar4 = uVar4 >> 0x2f ^ uVar12 ^ uVar4;
    uVar1 = (uVar4 * 0x5f20809e00000000 | uVar4 * -0x651e95c4d06fbfb1 >> 0x1f) * -0x651e95c4d06fbfb1
    ;
  }
  return uVar1;
}

Assistant:

uint64_t farmhash64_uo_with_seeds(const char *s, size_t len,
                         uint64_t seed0, uint64_t seed1) {
  if (len <= 64) {
    return farmhash64_na_with_seeds(s, len, seed0, seed1);
  }

  // For strings over 64 bytes we loop.  Internal state consists of
  // 64 bytes: u, v, w, x, y, and z.
  uint64_t x = seed0;
  uint64_t y = seed1 * k2 + 113;
  uint64_t z = smix(y * k2) * k2;
  uint128_c_t v = make_uint128_c_t(seed0, seed1);
  uint128_c_t w = make_uint128_c_t(0, 0);
  uint64_t u = x - z;
  x *= k2;
  uint64_t mul = k2 + (u & 0x82);

  // Set end so that after the loop we have 1 to 64 bytes left to process.
  const char* end = s + ((len - 1) / 64) * 64;
  const char* last64 = end + ((len - 1) & 63) - 63;
  assert(s + len - 64 == last64);
  do {
    uint64_t a0 = fetch64(s);
    uint64_t a1 = fetch64(s + 8);
    uint64_t a2 = fetch64(s + 16);
    uint64_t a3 = fetch64(s + 24);
    uint64_t a4 = fetch64(s + 32);
    uint64_t a5 = fetch64(s + 40);
    uint64_t a6 = fetch64(s + 48);
    uint64_t a7 = fetch64(s + 56);
    x += a0 + a1;
    y += a2;
    z += a3;
    v.a += a4;
    v.b += a5 + a1;
    w.a += a6;
    w.b += a7;

    x = ror64(x, 26);
    x *= 9;
    y = ror64(y, 29);
    z *= mul;
    v.a = ror64(v.a, 33);
    v.b = ror64(v.b, 30);
    w.a ^= x;
    w.a *= 9;
    z = ror64(z, 32);
    z += w.b;
    w.b += z;
    z *= 9;
    swap64(&u, &y);

    z += a0 + a6;
    v.a += a2;
    v.b += a3;
    w.a += a4;
    w.b += a5 + a6;
    x += a1;
    y += a7;

    y += v.a;
    v.a += x - y;
    v.b += w.a;
    w.a += v.b;
    w.b += x - y;
    x += w.b;
    w.b = ror64(w.b, 34);
    swap64(&u, &z);
    s += 64;
  } while (s != end);
  // Make s point to the last 64 bytes of input.
  s = last64;
  u *= 9;
  v.b = ror64(v.b, 28);
  v.a = ror64(v.a, 20);
  w.a += ((len - 1) & 63);
  u += y;
  y += u;
  x = ror64(y - x + v.a + fetch64(s + 8), 37) * mul;
  y = ror64(y ^ v.b ^ fetch64(s + 48), 42) * mul;
  x ^= w.b * 9;
  y += v.a + fetch64(s + 40);
  z = ror64(z + w.a, 33) * mul;
  v = weak_farmhash_na_len_32_with_seeds(s, v.b * mul, x + w.a);
  w = weak_farmhash_na_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
  return farmhash_uo_h(farmhash_len_16_mul(v.a + x, w.a ^ y, mul) + z - u,
           farmhash_uo_h(v.b + y, w.b + z, k2, 30) ^ x,
           k2,
           31);
}